

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O3

void __thiscall
TPZMatrix<std::complex<long_double>_>::AddKel
          (TPZMatrix<std::complex<long_double>_> *this,TPZFMatrix<std::complex<long_double>_> *elmat
          ,TPZVec<long> *destinationindex)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  complex<long_double> prevval;
  longdouble local_58;
  longdouble local_48;
  
  lVar1 = (elmat->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
  iVar4 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])();
  if (iVar4 == 0) {
    if (0 < lVar1) {
      lVar7 = 0;
      do {
        lVar2 = destinationindex->fStore[lVar7];
        lVar6 = 0;
        do {
          lVar3 = destinationindex->fStore[lVar6];
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_58,this,lVar2,lVar3);
          lVar5 = (elmat->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
          if ((lVar5 <= lVar7) ||
             ((elmat->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol <= lVar6
             )) {
            TPZFMatrix<std::complex<long_double>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar5 = lVar5 * lVar6;
          local_58 = local_58 + *(longdouble *)elmat->fElem[lVar5 + lVar7]._M_value;
          local_48 = local_48 + *(longdouble *)(elmat->fElem[lVar5 + lVar7]._M_value + 0x10);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,lVar2,lVar3,&local_58);
          lVar6 = lVar6 + 1;
        } while (lVar1 != lVar6);
        lVar7 = lVar7 + 1;
      } while (lVar7 != lVar1);
    }
  }
  else if (0 < lVar1) {
    lVar7 = 0;
    do {
      lVar2 = destinationindex->fStore[lVar7];
      lVar6 = lVar7;
      do {
        lVar3 = destinationindex->fStore[lVar6];
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (&local_58,this,lVar2,lVar3);
        lVar5 = (elmat->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
        if ((lVar5 <= lVar7) ||
           ((elmat->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol <= lVar6))
        {
          TPZFMatrix<std::complex<long_double>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        lVar5 = lVar5 * lVar6;
        local_58 = local_58 + *(longdouble *)elmat->fElem[lVar5 + lVar7]._M_value;
        local_48 = local_48 + *(longdouble *)(elmat->fElem[lVar5 + lVar7]._M_value + 0x10);
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                  (this,lVar2,lVar3,&local_58);
        lVar6 = lVar6 + 1;
      } while (lVar6 < lVar1);
      lVar7 = lVar7 + 1;
    } while (lVar7 != lVar1);
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &destinationindex) {
	
	int64_t nelem = elmat.Rows();
  	int64_t icoef,jcoef,ieq,jeq;
	if(IsSymmetric()) {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			for(jcoef=icoef; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				TVar prevval = GetVal(ieq,jeq);
				prevval += elmat(icoef,jcoef);
				PutVal(ieq,jeq,prevval);
			}
		}
	} else {
		for(icoef=0; icoef<nelem; icoef++) {
			ieq = destinationindex[icoef];
			for(jcoef=0; jcoef<nelem; jcoef++) {
				jeq = destinationindex[jcoef];
				TVar prevval = GetVal(ieq,jeq);
				prevval += elmat(icoef,jcoef);
				PutVal(ieq,jeq,prevval);
			}
		}
	}
}